

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::TokenIf::gettext(TokenIf *this,ostream *stream,data_map *data)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t j;
  data_map *in_stack_00000138;
  string *in_stack_00000140;
  TokenIf *in_stack_00000148;
  ulong local_50;
  string local_38 [32];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38,(string *)(in_RDI + 8));
  bVar1 = is_true(in_stack_00000148,in_stack_00000140,in_stack_00000138);
  std::__cxx11::string::~string(local_38);
  if (bVar1) {
    for (local_50 = 0;
        sVar2 = std::
                vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                ::size((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                        *)(in_RDI + 0x28)), local_50 < sVar2; local_50 = local_50 + 1) {
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      operator[]((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                  *)(in_RDI + 0x28),local_50);
      peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ea72a);
      (*peVar3->_vptr_Token[1])(peVar3,local_10,local_18);
    }
  }
  return;
}

Assistant:

inline void TokenIf::gettext( std::ostream &stream, data_map &data )
    {
        if (is_true(m_expr, data))
        {
            for(size_t j = 0 ; j < m_children.size() ; ++j)
            {
                m_children[j]->gettext(stream, data) ;
            }
        }
    }